

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_skydome.cpp
# Opt level: O0

void RenderDome(FMaterial *tex,float x_offset,float y_offset,bool mirror,int mode)

{
  short sVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  double dVar5;
  FLOATTYPE local_44;
  FLOATTYPE local_38;
  FLOATTYPE local_34;
  float yscale;
  float xscale;
  float skyoffsetfactor;
  int texw;
  int texh;
  int mode_local;
  bool mirror_local;
  float y_offset_local;
  float x_offset_local;
  FMaterial *tex_local;
  
  if (tex != (FMaterial *)0x0) {
    FRenderState::SetMaterial(&gl_RenderState,tex,0,0,-1,false);
    iVar2 = FMaterial::TextureWidth(tex);
    iVar3 = FMaterial::TextureHeight(tex);
    FRenderState::EnableModelMatrix(&gl_RenderState,true);
    VSMatrix::loadIdentity(&gl_RenderState.mModelMatrix);
    VSMatrix::rotate(&gl_RenderState.mModelMatrix,x_offset + -180.0,0.0,1.0,0.0);
    if (1024.0 <= (float)iVar2) {
      local_38 = 1.0;
    }
    else {
      dVar5 = std::floor((double)(ulong)(uint)(1024.0 / (float)iVar2));
      local_38 = SUB84(dVar5,0);
    }
    local_34 = 1.0;
    if (iVar3 < 0x80) {
      VSMatrix::translate(&gl_RenderState.mModelMatrix,0.0,-1250.0,0.0);
      VSMatrix::scale(&gl_RenderState.mModelMatrix,1.0,0.5565217,1.0);
      local_34 = (FLOATTYPE)(int)(0x80 / (long)iVar3);
    }
    else if (iVar3 < 200) {
      VSMatrix::translate(&gl_RenderState.mModelMatrix,0.0,-1250.0,0.0);
      VSMatrix::scale(&gl_RenderState.mModelMatrix,1.0,(float)iVar3 / 230.0,1.0);
    }
    else if (iVar3 < 0xf1) {
      sVar1 = tex->tex->SkyOffset;
      fVar4 = FFloatCVar::operator_cast_to_float(&skyoffset);
      VSMatrix::translate(&gl_RenderState.mModelMatrix,0.0,
                          ((float)((200 - iVar3) + (int)sVar1) + fVar4) * 57.0,0.0);
      VSMatrix::scale(&gl_RenderState.mModelMatrix,1.0,(((float)iVar3 - 200.0) / 200.0) * 1.17 + 1.0
                      ,1.0);
    }
    else {
      sVar1 = tex->tex->SkyOffset;
      fVar4 = FFloatCVar::operator_cast_to_float(&skyoffset);
      VSMatrix::translate(&gl_RenderState.mModelMatrix,0.0,((float)(sVar1 + -0x28) + fVar4) * 57.0,
                          0.0);
      VSMatrix::scale(&gl_RenderState.mModelMatrix,1.0,1.404,1.0);
      local_34 = 240.0 / (float)iVar3;
    }
    FRenderState::EnableTextureMatrix(&gl_RenderState,true);
    VSMatrix::loadIdentity(&gl_RenderState.mTextureMatrix);
    if (mirror) {
      local_44 = -local_38;
    }
    else {
      local_44 = local_38;
    }
    VSMatrix::scale(&gl_RenderState.mTextureMatrix,local_44,local_34,1.0);
    VSMatrix::translate(&gl_RenderState.mTextureMatrix,1.0,y_offset / (float)iVar3,1.0);
  }
  FSkyVertexBuffer::RenderDome(GLRenderer->mSkyVBO,tex,mode);
  FRenderState::EnableTextureMatrix(&gl_RenderState,false);
  FRenderState::EnableModelMatrix(&gl_RenderState,false);
  return;
}

Assistant:

void RenderDome(FMaterial * tex, float x_offset, float y_offset, bool mirror, int mode)
{
	int texh = 0;
	int texw = 0;

	// 57 world units roughly represent one sky texel for the glTranslate call.
	const float skyoffsetfactor = 57;

	if (tex)
	{
		gl_RenderState.SetMaterial(tex, CLAMP_NONE, 0, -1, false);
		texw = tex->TextureWidth();
		texh = tex->TextureHeight();
		gl_RenderState.EnableModelMatrix(true);

		gl_RenderState.mModelMatrix.loadIdentity();
		gl_RenderState.mModelMatrix.rotate(-180.0f + x_offset, 0.f, 1.f, 0.f);

		float xscale = texw < 1024.f ? floor(1024.f / float(texw)) : 1.f;
		float yscale = 1.f;
		if (texh < 128)
		{
			// smaller sky textures must be tiled. We restrict it to 128 sky pixels, though
			gl_RenderState.mModelMatrix.translate(0.f, -1250.f, 0.f);
			gl_RenderState.mModelMatrix.scale(1.f, 128 / 230.f, 1.f);
			yscale = 128 / texh;	// intentionally left as integer.
		}
		else if (texh < 200)
		{
			gl_RenderState.mModelMatrix.translate(0.f, -1250.f, 0.f);
			gl_RenderState.mModelMatrix.scale(1.f, texh / 230.f, 1.f);
		}
		else if (texh <= 240)
		{
			gl_RenderState.mModelMatrix.translate(0.f, (200 - texh + tex->tex->SkyOffset + skyoffset)*skyoffsetfactor, 0.f);
			gl_RenderState.mModelMatrix.scale(1.f, 1.f + ((texh - 200.f) / 200.f) * 1.17f, 1.f);
		}
		else
		{
			gl_RenderState.mModelMatrix.translate(0.f, (-40 + tex->tex->SkyOffset + skyoffset)*skyoffsetfactor, 0.f);
			gl_RenderState.mModelMatrix.scale(1.f, 1.2f * 1.17f, 1.f);
			yscale = 240.f / texh;
		}
		gl_RenderState.EnableTextureMatrix(true);
		gl_RenderState.mTextureMatrix.loadIdentity();
		gl_RenderState.mTextureMatrix.scale(mirror ? -xscale : xscale, yscale, 1.f);
		gl_RenderState.mTextureMatrix.translate(1.f, y_offset / texh, 1.f);
	}

	GLRenderer->mSkyVBO->RenderDome(tex, mode);
	gl_RenderState.EnableTextureMatrix(false);
	gl_RenderState.EnableModelMatrix(false);
}